

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZTensor<TFad<6,_double>_>,_3>::TPZManVector
          (TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *this,
          TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  long lVar4;
  TPZTensor<TFad<6,_double>_> *pTVar5;
  ulong uVar6;
  TPZTensor<TFad<6,_double>_> *pTVar7;
  ulong uVar8;
  
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = (TPZTensor<TFad<6,_double>_> *)0x0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = 0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0189f620;
  pTVar7 = this->fExtAlloc;
  lVar4 = 0;
  pTVar5 = pTVar7;
  do {
    TPZTensor<TFad<6,_double>_>::TPZTensor(pTVar5);
    lVar4 = lVar4 + -0x1a8;
    pTVar5 = pTVar5 + 1;
  } while (lVar4 != -0x4f8);
  uVar8 = (copy->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements;
  if ((long)uVar8 < 4) {
    uVar2 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar8;
    uVar2 = SUB168(auVar1 * ZEXT816(0x1a8),0);
    uVar6 = uVar2 + 8;
    if (0xfffffffffffffff7 < uVar2) {
      uVar6 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x1a8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar3 = (ulong *)operator_new__(uVar6);
    *puVar3 = uVar8;
    pTVar7 = (TPZTensor<TFad<6,_double>_> *)(puVar3 + 1);
    lVar4 = 0;
    pTVar5 = pTVar7;
    do {
      TPZTensor<TFad<6,_double>_>::TPZTensor(pTVar5);
      lVar4 = lVar4 + -0x1a8;
      pTVar5 = pTVar5 + 1;
      uVar2 = uVar8;
    } while (uVar8 * -0x1a8 - lVar4 != 0);
  }
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = pTVar7;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = uVar8;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = uVar2;
  if (0 < (long)uVar8) {
    lVar4 = 8;
    do {
      TPZManVector<TFad<6,_double>,_6>::operator=
                ((TPZManVector<TFad<6,_double>,_6> *)
                 ((long)(((this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore)->fData).
                        fExtAlloc[0].dx_ + lVar4 + -0x38),
                 (TPZManVector<TFad<6,_double>,_6> *)
                 ((long)(((copy->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore)->fData).
                        fExtAlloc[0].dx_ + lVar4 + -0x38));
      lVar4 = lVar4 + 0x1a8;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}